

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

bool trimesh::is_t_lt_abs_diff(mscomplex_t *msc,double t,int i)

{
  double dVar1;
  size_type sVar2;
  ostream *poVar3;
  runtime_error *this;
  size_type sVar4;
  const_reference pvVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  int local_24;
  double dStack_20;
  int i_local;
  double t_local;
  mscomplex_t *msc_local;
  
  local_24 = i;
  dStack_20 = t;
  t_local = (double)msc;
  if (-1 < i) {
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      (&msc->m_canc_list);
    if ((ulong)(long)i < sVar2 + 1) {
      sVar2 = (size_type)local_24;
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         ((long)t_local + 200));
      dVar6 = t_local;
      dVar1 = dStack_20;
      if (sVar2 == sVar4) {
        msc_local._7_1_ = false;
      }
      else {
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            ((long)t_local + 200),(long)local_24);
        mscomplex_t::fn((mscomplex_t *)dVar6,pvVar5->first);
        dVar6 = t_local;
        pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            ((long)t_local + 200),(long)local_24);
        mscomplex_t::fn((mscomplex_t *)dVar6,pvVar5->second);
        std::abs(SUB84(dVar6,0));
        msc_local._7_1_ = dVar1 < extraout_XMM0_Qa;
      }
      return msc_local._7_1_;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar3 = std::operator<<(local_1a0,"Failed to assert condition ");
  poVar3 = std::operator<<(poVar3,"is_in_range(i,0,msc->m_canc_list.size()+1)");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"is_t_lt_abs_diff");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x243);
  std::operator<<(poVar3,") \n ");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_t_lt_abs_diff(const mscomplex_t * msc, double t,int i)
{
  ASSERT(is_in_range(i,0,msc->m_canc_list.size()+1));

  if( i == msc->m_canc_list.size())
    return false;
  else
    return t < std::abs
        (msc->fn(msc->m_canc_list[i].first) -
         msc->fn(msc->m_canc_list[i].second));
}